

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.c
# Opt level: O1

int h264_prep_sgmap(h264_slice *slice)

{
  uint32_t uVar1;
  uint32_t uVar2;
  h264_picparm *phVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint32_t uVar9;
  int *piVar10;
  int iVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  int iVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  ulong uVar22;
  uint uVar23;
  int iVar24;
  uint32_t uVar25;
  ulong uVar26;
  uint uVar27;
  int iVar28;
  bool bVar29;
  
  if (slice->sgmap == (int *)0x0) {
    phVar3 = slice->picparm;
    uVar1 = slice->seqparm->pic_width_in_mbs_minus1;
    uVar2 = slice->seqparm->pic_height_in_map_units_minus1;
    iVar24 = uVar1 + 1;
    iVar6 = uVar2 + 1;
    uVar21 = phVar3->num_slice_groups_minus1;
    uVar15 = iVar6 * iVar24;
    piVar10 = (int *)calloc(4,(long)(int)uVar15);
    slice->sgmap = piVar10;
    uVar23 = (phVar3->slice_group_change_rate_minus1 + 1) * slice->slice_group_change_cycle;
    if ((int)uVar15 <= (int)uVar23) {
      uVar23 = uVar15;
    }
    uVar5 = uVar15 - uVar23;
    if (phVar3->slice_group_change_direction_flag == 0) {
      uVar5 = uVar23;
    }
    if (0 < (int)uVar15) {
      iVar11 = uVar21 + 1;
      uVar7 = uVar21 - 1;
      uVar26 = 0;
      uVar27 = 0;
      uVar16 = 0;
      do {
        uVar22 = (ulong)(uint)((int)uVar26 >> 0x1f) << 0x20 | uVar26 & 0xffffffff;
        phVar3 = slice->picparm;
        iVar28 = (int)((long)uVar22 % (long)iVar24);
        iVar18 = (int)((long)uVar22 / (long)iVar24);
        switch(phVar3->slice_group_map_type) {
        case 0:
          slice->sgmap[uVar26] = uVar27;
          if (uVar16 != phVar3->run_length_minus1[(int)uVar27]) {
            uVar16 = uVar16 + 1;
            goto LAB_00107285;
          }
          bVar29 = true;
          uVar16 = 0;
          uVar27 = (int)(uVar27 + 1) % iVar11;
          break;
        case 1:
          slice->sgmap[uVar26] = ((iVar18 * iVar11) / 2 + iVar28) % iVar11;
          goto LAB_00107285;
        case 2:
          piVar10 = slice->sgmap;
          piVar10[uVar26] = uVar21;
          bVar29 = true;
          uVar22 = (ulong)uVar7;
          uVar27 = uVar7;
          if (-1 < (int)uVar7) {
            do {
              uVar27 = slice->pic_width_in_mbs;
              if (((((int)(phVar3->top_left[uVar22] % uVar27) <= iVar28) &&
                   (iVar18 <= (int)(phVar3->bottom_right[uVar22] / uVar27))) &&
                  ((int)(phVar3->top_left[uVar22] / uVar27) <= iVar18)) &&
                 (iVar28 <= (int)(phVar3->bottom_right[uVar22] % uVar27))) {
                piVar10[uVar26] = (int)uVar22;
              }
              bVar4 = 0 < (long)uVar22;
              uVar22 = uVar22 - 1;
            } while (bVar4);
            uVar27 = 0xffffffff;
          }
          break;
        case 3:
          slice->sgmap[uVar26] = 1;
          goto LAB_00107285;
        case 4:
          uVar8 = (uint)((long)(int)uVar5 <= (long)uVar26) ^
                  phVar3->slice_group_change_direction_flag;
LAB_00107276:
          slice->sgmap[uVar26] = uVar8;
LAB_00107285:
          bVar29 = true;
          break;
        case 5:
          uVar16 = iVar28 * iVar6 + iVar18;
          slice->sgmap[uVar26] =
               (uint)((int)uVar5 <= (int)uVar16) ^ phVar3->slice_group_change_direction_flag;
          bVar29 = true;
          break;
        case 6:
          if (uVar15 == phVar3->pic_size_in_map_units_minus1 + 1) {
            uVar8 = phVar3->slice_group_id[uVar26];
            goto LAB_00107276;
          }
          h264_prep_sgmap_cold_1();
          bVar29 = false;
          break;
        default:
          abort();
        }
        if (!bVar29) {
          return 1;
        }
        uVar26 = uVar26 + 1;
      } while (uVar26 != uVar15);
    }
    if (slice->picparm->slice_group_map_type == 3) {
      if ((int)uVar23 < 1) {
        return 0;
      }
      uVar25 = slice->picparm->slice_group_change_direction_flag;
      uVar21 = uVar25 - 1;
      uVar9 = (int)(iVar6 - uVar25) / 2;
      uVar12 = (int)(iVar24 - uVar25) / 2;
      piVar10 = slice->sgmap;
      uVar16 = uVar25 * 2 - 1;
      uVar19 = uVar25 * -2 + 1;
      iVar6 = 0;
      uVar20 = uVar12;
      uVar13 = uVar9;
      uVar17 = uVar12;
      uVar14 = uVar9;
      do {
        iVar28 = uVar13 * iVar24 + uVar17;
        iVar11 = piVar10[iVar28];
        piVar10[iVar28] = 0;
        if ((uVar21 == 0xffffffff) && (uVar17 == uVar20)) {
          uVar21 = 0;
          bVar29 = uVar20 == 0;
          uVar20 = uVar20 - 1;
          uVar25 = uVar16;
          uVar17 = uVar20;
          if (bVar29) {
            uVar20 = 0;
            uVar17 = 0;
          }
        }
        else if ((uVar21 == 1) && (uVar17 == uVar12)) {
          uVar12 = (uVar12 != uVar1) + uVar12;
          uVar25 = uVar19;
          uVar17 = uVar12;
          uVar21 = 0;
        }
        else if ((uVar25 == 0xffffffff) && (uVar13 == uVar9)) {
          bVar29 = uVar9 == 0;
          uVar9 = uVar9 - 1;
          uVar25 = 0;
          uVar13 = uVar9;
          uVar21 = uVar19;
          if (bVar29) {
            uVar9 = 0;
            uVar13 = 0;
          }
        }
        else if ((uVar25 == 1) && (uVar13 == uVar14)) {
          uVar14 = (uVar14 != uVar2) + uVar14;
          uVar25 = 0;
          uVar13 = uVar14;
          uVar21 = uVar16;
        }
        else {
          uVar13 = uVar13 + uVar25;
          uVar17 = uVar17 + uVar21;
        }
        iVar6 = iVar6 + iVar11;
      } while (iVar6 < (int)uVar23);
    }
  }
  return 0;
}

Assistant:

int h264_prep_sgmap(struct h264_slice *slice) {
	if (slice->sgmap)
		return 0;
	int width = slice->seqparm->pic_width_in_mbs_minus1 + 1;
	int height = slice->seqparm->pic_height_in_map_units_minus1 + 1;
	int i, j, k;
	int num = slice->picparm->num_slice_groups_minus1 + 1;
	slice->sgmap = calloc(sizeof *slice->sgmap, width * height);
	j = 0, k = 0;
	int musg0 = slice->slice_group_change_cycle * (slice->picparm->slice_group_change_rate_minus1 + 1);
	if (musg0 > width * height)
		musg0 = width * height;
	int sulg = musg0;
	if (slice->picparm->slice_group_change_direction_flag)
		sulg = width * height - sulg;
	for (i = 0; i < width * height; i++) {
		int x = i % width;
		int y = i / width;
		switch (slice->picparm->slice_group_map_type) {
			case H264_SLICE_GROUP_MAP_INTERLEAVED:
				slice->sgmap[i] = j;
				if (k == slice->picparm->run_length_minus1[j]) {
					k = 0;
					j++;
					j %= num;
				} else {
					k++;
				}
				break;
			case H264_SLICE_GROUP_MAP_DISPERSED:
				slice->sgmap[i] = (x + ((y * num) / 2)) % num;
				break;
			case H264_SLICE_GROUP_MAP_FOREGROUND:
				slice->sgmap[i] = num-1;
				for (j = num - 2; j >= 0; j--) {
					int xtl = slice->picparm->top_left[j] % slice->pic_width_in_mbs;
					int ytl = slice->picparm->top_left[j] / slice->pic_width_in_mbs;
					int xbr = slice->picparm->bottom_right[j] % slice->pic_width_in_mbs;
					int ybr = slice->picparm->bottom_right[j] / slice->pic_width_in_mbs;
					if (x >= xtl && x <= xbr && y >= ytl && y <= ybr)
						slice->sgmap[i] = j;
				}
				break;
			case H264_SLICE_GROUP_MAP_CHANGING_BOX:
				slice->sgmap[i] = 1;
				/* will be fixed below */
				break;
			case H264_SLICE_GROUP_MAP_CHANGING_VERTICAL:
				slice->sgmap[i] = slice->picparm->slice_group_change_direction_flag ^ (i >= sulg);
				break;
			case H264_SLICE_GROUP_MAP_CHANGING_HORIZONTAL:
				k = x * height + y;
				slice->sgmap[i] = slice->picparm->slice_group_change_direction_flag ^ (k >= sulg);
				break;
			case H264_SLICE_GROUP_MAP_EXPLICIT:
				if (width * height != slice->picparm->pic_size_in_map_units_minus1 + 1) {
					fprintf(stderr, "pic_size_in_map_units_minus1 mismatch!\n");
					return 1;
				}
				slice->sgmap[i] = slice->picparm->slice_group_id[i];
				break;
			default:
				abort();
		}
	}
	if (slice->picparm->slice_group_map_type == H264_SLICE_GROUP_MAP_CHANGING_BOX) {
		int cdf = slice->picparm->slice_group_change_direction_flag;
		int x = (width - cdf) / 2;
		int y = (height - cdf) / 2;
		int xmin = x, xmax = x;
		int ymin = y, ymax = y;
		int xdir = cdf - 1;
		int ydir = cdf;
		int muv;
		for (k = 0; k < musg0; k += muv) {
			muv = slice->sgmap[y * width + x];
			slice->sgmap[y * width + x] = 0;
			if (xdir == -1 && x == xmin) {
				if (xmin)
					xmin--;
				x = xmin;
				xdir = 0;
				ydir = 2 * cdf - 1;
			} else if (xdir == 1 && x == xmax) {
				if (xmax != width - 1)
					xmax++;
				x = xmax;
				xdir = 0;
				ydir = 1 - 2 * cdf;
			} else if (ydir == -1 && y == ymin) {
				if (ymin)
					ymin--;
				y = ymin;
				xdir = 1 - 2 * cdf;
				ydir = 0;
			} else if (ydir == 1 && y == ymax) {
				if (ymax != height - 1)
					ymax++;
				y = ymax;
				xdir = 2 * cdf - 1;
				ydir = 0;
			} else {
				x += xdir;
				y += ydir;
			}
		}
	}
	return 0;
}